

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O3

void __thiscall BmsParser::Parser::ParseMeasure(Parser *this,char *str)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint pos;
  BmsBarManager *this_00;
  double l;
  undefined2 local_28;
  char local_26;
  undefined1 local_25;
  
  bVar2 = anon_unknown_2::IsBar(str);
  if ((bVar2) && (iVar3 = atoi(str + 3), iVar3 == 2)) {
    if (str == (char *)0x0) {
      std::__throw_logic_error("basic_string::_M_construct null not valid");
    }
    local_26 = str[2];
    local_28 = *(undefined2 *)str;
    local_25 = 0;
    pos = atoi((char *)&local_28);
    do {
      cVar1 = *str;
      str = str + 1;
    } while (cVar1 != ':');
    for (; (*str == ' ' || (*str == '\t')); str = str + 1) {
    }
    l = atof(str);
    this_00 = BmsBms::GetBarManager(this->bms_);
    BmsBarManager::SetRatio(this_00,pos,l,true);
  }
  return;
}

Assistant:

void Parser::ParseMeasure(const char* str)
	{
		if (!IsBar(str)) return;
		// if channel isn't 02(BAR channel)
		// then ignore
		int channel = atoi(str + 3);
		if (channel != 2) return;
		int bar_ = atoi(std::string(str, 3).c_str());
		const char* value_s_ = ParseColon(str);
		if (!value_s_) {
			WriteLogLine("line %d - cannot parse measure length (%s)", line_, str);
			return;
		}
		double value_ = atof(Trim(value_s_));
		bms_.GetBarManager().SetRatio(bar_, value_);
	}